

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<bool>::captureExpression<(Catch::Internal::Operator)0,bool>
          (ExpressionLhs<bool> *this,bool *rhs)

{
  bool result;
  ExpressionResultBuilder *pEVar1;
  char *pcVar2;
  allocator local_89;
  string local_88 [32];
  Catch local_68 [48];
  Catch local_38 [32];
  bool *local_18;
  bool *rhs_local;
  ExpressionLhs<bool> *this_local;
  
  local_18 = rhs;
  rhs_local = (bool *)this;
  result = Internal::compare<(Catch::Internal::Operator)0,bool,bool>(&this->m_lhs,rhs);
  pEVar1 = ExpressionResultBuilder::setResultType(&this->m_result,result);
  toString_abi_cxx11_(local_38,(bool)(this->m_lhs & 1));
  pEVar1 = ExpressionResultBuilder::setLhs(pEVar1,(string *)local_38);
  toString_abi_cxx11_(local_68,(bool)(*local_18 & 1));
  pEVar1 = ExpressionResultBuilder::setRhs(pEVar1,(string *)local_68);
  pcVar2 = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar2,&local_89);
  pEVar1 = ExpressionResultBuilder::setOp(pEVar1,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_38);
  return pEVar1;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }